

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalDeclarationStatement.h
# Opt level: O0

void __thiscall
LocalDeclarationStatement::LocalDeclarationStatement
          (LocalDeclarationStatement *this,Identifier *identifier,bool constant,
          ptr<Expression> *expression)

{
  ptr<Expression> *expression_local;
  bool constant_local;
  Identifier *identifier_local;
  LocalDeclarationStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_00194120;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->constant = constant;
  std::shared_ptr<Expression>::shared_ptr(&this->expression,expression);
  return;
}

Assistant:

LocalDeclarationStatement(Identifier identifier, bool constant, ptr<Expression> expression)
        : identifier(std::move(identifier)), constant(constant), expression(expression) { }